

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wmb.cpp
# Opt level: O3

factor * __thiscall
merlin::wmb::incoming(factor *__return_storage_ptr__,wmb *this,findex a,size_t i)

{
  pointer pmVar1;
  pointer puVar2;
  
  factor::binaryOp<merlin::factor::binOpTimes>
            (__return_storage_ptr__,
             (this->super_graphical_model).m_factors.
             super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>._M_impl.
             super__Vector_impl_data._M_start + a,
             (this->m_reparam).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>.
             _M_impl.super__Vector_impl_data._M_start + a);
  pmVar1 = (this->m_in).
           super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (puVar2 = *(pointer *)
                 &pmVar1[a].super_my_vector<unsigned_long>.
                  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>;
      puVar2 != *(pointer *)
                 ((long)&pmVar1[a].super_my_vector<unsigned_long>.
                         super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_> + 8);
      puVar2 = puVar2 + 1) {
    factor::binaryOpIP<merlin::factor::binOpTimes>
              (__return_storage_ptr__,
               (this->m_forward).super__Vector_base<merlin::factor,_std::allocator<merlin::factor>_>
               ._M_impl.super__Vector_impl_data._M_start +
               *(long *)(*(long *)&(this->m_edge_indeces).
                                   super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[*puVar2].
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data + a * 8));
    pmVar1 = (this->m_in).
             super__Vector_base<merlin::my_set<unsigned_long>,_std::allocator<merlin::my_set<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  return __return_storage_ptr__;
}

Assistant:

factor wmb::incoming(findex a, size_t i) {

	factor bel = m_factors[a] * m_reparam[a];

	// forward messages to 'a'
	for (flist::const_iterator ci = m_in[a].begin();
			ci != m_in[a].end(); ++ci) {
		findex p = (*ci);
		size_t j = m_edge_indeces[p][a];
		bel *= m_forward[j];
		//_norm[i] += _norm[j];
	}

	return bel;
}